

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ModuleDeclarationSyntax::ModuleDeclarationSyntax
          (ModuleDeclarationSyntax *this,SyntaxKind kind,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,ModuleHeaderSyntax *header,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token endmodule,
          NamedBlockClauseSyntax *blockName)

{
  bool bVar1;
  ModuleHeaderSyntax *pMVar2;
  reference ppMVar3;
  SyntaxList<slang::syntax::MemberSyntax> *in_RDI;
  MemberSyntax *in_R9;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SyntaxList<slang::syntax::MemberSyntax> *this_00;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffffa8;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_48;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffc0;
  ModuleHeaderSyntax *in_stack_ffffffffffffffc8;
  
  this_00 = (SyntaxList<slang::syntax::MemberSyntax> *)&stack0x00000008;
  MemberSyntax::MemberSyntax
            (in_R9,(SyntaxKind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),in_stack_ffffffffffffffc0)
  ;
  not_null<slang::syntax::ModuleHeaderSyntax_*>::not_null<slang::syntax::ModuleHeaderSyntax_*>
            ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)
             &in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode,
             (ModuleHeaderSyntax **)&stack0xffffffffffffffc8);
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(in_RDI,this_00);
  in_RDI[2].super_SyntaxListBase.childCount =
       (size_t)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[2].super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       *(pointer *)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[2].super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = (size_t)in_R9;
  pMVar2 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                     ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0x511915);
  (pMVar2->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
  in_RDI[1].super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = (size_t)in_RDI;
  local_48._M_current =
       (MemberSyntax **)
       std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)this_00);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_48);
    ((*ppMVar3)->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_48);
  }
  if (in_RDI[2].super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
      _M_extent_value != 0) {
    *(SyntaxList<slang::syntax::MemberSyntax> **)
     (in_RDI[2].super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
      _M_extent_value + 8) = in_RDI;
  }
  return;
}

Assistant:

ModuleDeclarationSyntax(SyntaxKind kind, const SyntaxList<AttributeInstanceSyntax>& attributes, ModuleHeaderSyntax& header, const SyntaxList<MemberSyntax>& members, Token endmodule, NamedBlockClauseSyntax* blockName) :
        MemberSyntax(kind, attributes), header(&header), members(members), endmodule(endmodule), blockName(blockName) {
        this->header->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->blockName) this->blockName->parent = this;
    }